

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O3

SetLogLevelError emulator_set_log_level_from_string(char *s)

{
  char *__s;
  int iVar1;
  SetLogLevelError SVar2;
  char *pcVar3;
  size_t __n;
  long lVar4;
  undefined8 *puVar5;
  
  pcVar3 = strchr(s,0x3d);
  if (pcVar3 == (char *)0x0) {
    SVar2 = SET_LOG_LEVEL_ERROR_INVALID_FORMAT;
  }
  else {
    puVar5 = &DAT_001dfc18;
    lVar4 = 0;
    do {
      __s = (char *)*puVar5;
      __n = strlen(__s);
      iVar1 = strncmp(s,__s,__n);
      if (iVar1 == 0) {
        iVar1 = atoi(pcVar3 + 1);
        *(int *)((long)s_log_level + lVar4) = iVar1;
        return SET_LOG_LEVEL_ERROR_NONE;
      }
      lVar4 = lVar4 + 4;
      puVar5 = puVar5 + 1;
    } while ((int)lVar4 != 0x18);
    SVar2 = SET_LOG_LEVEL_ERROR_UNKNOWN_LOG_SYSTEM;
  }
  return SVar2;
}

Assistant:

SetLogLevelError emulator_set_log_level_from_string(const char* s) {
  const char* log_system_name = s;
  const char* equals = strchr(s, '=');
  if (!equals) {
    return SET_LOG_LEVEL_ERROR_INVALID_FORMAT;
  }

  LogSystem system = NUM_LOG_SYSTEMS;
  int i;
  for (i = 0; i < NUM_LOG_SYSTEMS; ++i) {
    const char* name = emulator_get_log_system_name(i);
    if (strncmp(log_system_name, name, strlen(name)) == 0) {
      system = i;
      break;
    }
  }

  if (system == NUM_LOG_SYSTEMS) {
    return SET_LOG_LEVEL_ERROR_UNKNOWN_LOG_SYSTEM;
  }

  emulator_set_log_level(system, atoi(equals + 1));
  return SET_LOG_LEVEL_ERROR_NONE;
}